

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  time_t tVar4;
  char *__ptr;
  per_transfer **per;
  _Bool _Var5;
  _Bool getadded;
  _Bool *local_40;
  CURLM *local_38;
  
  *addedp = false;
  *morep = false;
  local_38 = multi;
  if ((all_pers < (long)(ulong)((uint)global->parallel_max * 2)) &&
     (CVar2 = create_transfer(global,share,addedp), CVar2 != CURLE_OK)) {
    return CVar2;
  }
  per = &transfers;
  local_40 = morep;
  _Var1 = false;
LAB_00115080:
  do {
    _Var5 = _Var1;
    per = &((per_transfer *)per)->next->next;
    if ((per_transfer *)per == (per_transfer *)0x0) {
LAB_001151c9:
      *local_40 = _Var5;
      return CURLE_OK;
    }
    if ((long)(ulong)global->parallel_max <= all_added) {
      _Var5 = true;
      goto LAB_001151c9;
    }
    getadded = false;
    _Var1 = _Var5;
  } while (((per_transfer *)per)->added != false);
  if (((per_transfer *)per)->startat != 0) {
    tVar4 = time((time_t *)0x0);
    _Var1 = true;
    if (tVar4 < ((per_transfer *)per)->startat) goto LAB_00115080;
  }
  ((per_transfer *)per)->added = true;
  CVar2 = pre_transfer(global,(per_transfer *)per);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  __ptr = (char *)malloc(0x100);
  if (__ptr == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  curl_easy_setopt(((per_transfer *)per)->curl,0xed,global->parallel_connect ^ 1);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2777,per);
  curl_easy_setopt(((per_transfer *)per)->curl,0x4efb,xferinfo_cb);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2749,per);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2b,0);
  iVar3 = curl_multi_add_handle(local_38,((per_transfer *)per)->curl);
  if (iVar3 == 0) {
    CVar2 = create_transfer(global,share,&getadded);
    if (CVar2 == CURLE_OK) {
      *__ptr = '\0';
      curl_easy_setopt(((per_transfer *)per)->curl,0x271a,__ptr);
      ((per_transfer *)per)->errorbuffer = __ptr;
      ((per_transfer *)per)->added = true;
      all_added = all_added + 1;
      *addedp = true;
      _Var1 = _Var5;
      goto LAB_00115080;
    }
  }
  else {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  free(__ptr);
  return CVar2;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  char *errorbuf;
  *addedp = FALSE;
  *morep = FALSE;
  if(all_pers < (global->parallel_max*2)) {
    result = create_transfer(global, share, addedp);
    if(result)
      return result;
  }
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    bool getadded = FALSE;
    if(per->added)
      /* already added */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }
    per->added = TRUE;

    result = pre_transfer(global, per);
    if(result)
      return result;

    errorbuf = malloc(CURL_ERROR_SIZE);
    if(!errorbuf)
      return CURLE_OUT_OF_MEMORY;

    /* parallel connect means that we do not set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_NOPROGRESS, 0L);
#ifdef DEBUGBUILD
    if(getenv("CURL_FORBID_REUSE"))
      (void)curl_easy_setopt(per->curl, CURLOPT_FORBID_REUSE, 1L);
#endif

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode) {
      DEBUGASSERT(mcode == CURLM_OUT_OF_MEMORY);
      result = CURLE_OUT_OF_MEMORY;
    }

    if(!result)
      result = create_transfer(global, share, &getadded);
    if(result) {
      free(errorbuf);
      return result;
    }
    errorbuf[0] = 0;
    (void)curl_easy_setopt(per->curl, CURLOPT_ERRORBUFFER, errorbuf);
    per->errorbuffer = errorbuf;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping) ? TRUE : FALSE;
  return CURLE_OK;
}